

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall UI::State::changeColorScheme(State *this,bool inc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImGuiStyle *pIVar14;
  ulong uVar15;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,inc) != 0) {
    this->colorScheme = this->colorScheme + ((int)(this->colorScheme + Dark) / 3) * -3 + Dark;
  }
  pIVar14 = ImGui::GetStyle();
  uVar15 = (ulong)this->colorScheme;
  if (uVar15 < 3) {
    fVar1 = *(float *)(&DAT_001651ec + uVar15 * 4);
    fVar2 = *(float *)(&DAT_001651f8 + uVar15 * 4);
    fVar3 = *(float *)(&DAT_00165204 + uVar15 * 4);
    fVar4 = *(float *)(&DAT_00165210 + uVar15 * 4);
    fVar5 = *(float *)(&DAT_0016521c + uVar15 * 4);
    fVar6 = *(float *)(&DAT_00165228 + uVar15 * 4);
    fVar7 = *(float *)(&DAT_00165234 + uVar15 * 4);
    fVar8 = *(float *)(&DAT_00165240 + uVar15 * 4);
    fVar9 = *(float *)(&DAT_0016524c + uVar15 * 4);
    fVar10 = *(float *)(&DAT_00165258 + uVar15 * 4);
    fVar11 = *(float *)(&DAT_00165264 + uVar15 * 4);
    fVar12 = *(float *)(&DAT_00165270 + uVar15 * 4);
    fVar13 = *(float *)(&DAT_0016527c + uVar15 * 4);
    pIVar14->Colors[0].x = fVar1;
    pIVar14->Colors[0].y = fVar2;
    pIVar14->Colors[0].z = fVar1;
    *(undefined8 *)&pIVar14->Colors[0].w = 0x3f19999a3f800000;
    pIVar14->Colors[1].y = 0.6;
    pIVar14->Colors[1].z = 0.6;
    pIVar14->Colors[1].w = 1.0;
    pIVar14->Colors[2].x = fVar3;
    pIVar14->Colors[2].y = fVar3;
    pIVar14->Colors[2].z = fVar4;
    pIVar14->Colors[2].w = 1.0;
    pIVar14->Colors[10].x = fVar5;
    pIVar14->Colors[10].y = fVar6;
    pIVar14->Colors[10].z = fVar7;
    pIVar14->Colors[10].w = fVar8;
    pIVar14->Colors[0xb].x = fVar5;
    pIVar14->Colors[0xb].y = fVar6;
    pIVar14->Colors[0xb].z = fVar7;
    pIVar14->Colors[0xb].w = fVar8;
    pIVar14->Colors[0xc].x = fVar9;
    pIVar14->Colors[0xc].y = fVar10;
    pIVar14->Colors[0xc].z = fVar11;
    pIVar14->Colors[0xc].w = fVar8;
    pIVar14->Colors[3].x = fVar3;
    pIVar14->Colors[3].y = fVar3;
    pIVar14->Colors[3].z = fVar4;
    pIVar14->Colors[3].w = 1.0;
    pIVar14->Colors[4].x = fVar12;
    pIVar14->Colors[4].y = fVar12;
    pIVar14->Colors[4].z = fVar13;
    pIVar14->Colors[4].w = 1.0;
    pIVar14->Colors[0x34].x = 0.0;
    pIVar14->Colors[0x34].y = 0.0;
    pIVar14->Colors[0x34].z = 0.0;
    pIVar14->Colors[0x34].w = 0.0;
  }
  return;
}

Assistant:

void changeColorScheme(bool inc = true) {
        if (inc) {
            colorScheme = (ColorScheme)(((int) colorScheme + 1) % ((int)ColorScheme::COUNT));
        }

        ImVec4* colors = ImGui::GetStyle().Colors;
        switch (colorScheme) {
            case ColorScheme::Default:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Dark:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 0.50f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Green:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 1.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.50f, 1.00f, 0.50f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            default:
                {
                }
        }
    }